

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiOutAlsa::sendMessage(MidiOutAlsa *this,uchar *message,size_t size)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  string *psVar5;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ulong uVar8;
  _Alloc_hider _Var9;
  uint uVar10;
  undefined8 *puVar11;
  uint uVar12;
  snd_seq_event_t ev;
  undefined8 local_108;
  undefined4 uStack_100;
  undefined1 uStack_fc;
  undefined1 uStack_fb;
  undefined2 uStack_fa;
  undefined4 uStack_f8;
  undefined8 uStack_f4;
  undefined8 *local_e0;
  ulong local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  puVar11 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  uVar12 = (uint)size;
  if (*(uint *)(puVar11 + 4) < uVar12) {
    *(uint *)(puVar11 + 4) = uVar12;
    iVar3 = snd_midi_event_resize_buffer(puVar11[3]);
    if (iVar3 == 0) {
      free((void *)puVar11[5]);
      pvVar4 = malloc((ulong)*(uint *)(puVar11 + 4));
      puVar11[5] = pvVar4;
      if (pvVar4 != (void *)0x0) goto LAB_0010ae81;
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                 (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                 0x10d579);
      pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,
                 pcVar1 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
      MidiApi::error((MidiApi *)this,MEMORY_ERROR,&local_b0);
      _Var9._M_p = local_b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
        return;
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                 (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                 0x10d77a);
      pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,
                 pcVar1 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_90);
      local_b0.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
      _Var9._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        return;
      }
    }
    operator_delete(_Var9._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  else {
LAB_0010ae81:
    if (uVar12 != 0) {
      uVar8 = 0;
      do {
        *(uchar *)(puVar11[5] + uVar8) = message[uVar8];
        uVar8 = uVar8 + 1;
      } while ((size & 0xffffffff) != uVar8);
    }
    psVar5 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
    uVar8 = 0;
    local_e0 = puVar11;
    do {
      paVar7 = &local_d0.field_2;
      uVar10 = (uint)uVar8;
      if (uVar12 < uVar10 || uVar12 - uVar10 == 0) {
        snd_seq_drain_output(*puVar11);
        return;
      }
      uStack_f8 = 0;
      uStack_f4 = 0;
      uStack_100 = 0;
      uStack_fc = 0;
      uStack_fb = *(undefined1 *)((long)puVar11 + 0xc);
      uStack_fa = 0xfdfe;
      local_108 = 0xfd000000;
      lVar6 = snd_midi_event_encode
                        (puVar11[3],(uVar8 & 0xffffffff) + puVar11[5],uVar12 - uVar10,&local_108);
      if (lVar6 < 0) {
        std::__cxx11::string::_M_replace
                  ((ulong)psVar5,0,
                   (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                   0x10d7bb);
        pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
        local_d0._M_dataplus._M_p = (pointer)paVar7;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar1,
                   pcVar1 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
        MidiApi::error((MidiApi *)this,WARNING,&local_d0);
        _Var9._M_p = local_d0._M_dataplus._M_p;
        puVar11 = local_e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == paVar7) {
          bVar2 = false;
        }
        else {
LAB_0010b0b1:
          operator_delete(_Var9._M_p,paVar7->_M_allocated_capacity + 1);
          bVar2 = false;
        }
      }
      else if ((char)local_108 == -1) {
        local_d8 = uVar8;
        std::__cxx11::string::_M_replace
                  ((ulong)psVar5,0,
                   (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                   0x10d7ea);
        paVar7 = &local_50.field_2;
        pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
        local_50._M_dataplus._M_p = (pointer)paVar7;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,
                   pcVar1 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
        MidiApi::error((MidiApi *)this,WARNING,&local_50);
        _Var9._M_p = local_50._M_dataplus._M_p;
        uVar8 = local_d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar7) goto LAB_0010b0b1;
        bVar2 = false;
      }
      else {
        uVar8 = (ulong)(uVar10 + (int)lVar6);
        iVar3 = snd_seq_event_output(*puVar11);
        bVar2 = true;
        if (iVar3 < 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)psVar5,0,
                     (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                     0x10d818);
          paVar7 = &local_70.field_2;
          pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)paVar7;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar1,
                     pcVar1 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
          MidiApi::error((MidiApi *)this,WARNING,&local_70);
          _Var9._M_p = local_70._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar7) goto LAB_0010b0b1;
          bVar2 = false;
        }
      }
    } while (bVar2);
  }
  return;
}

Assistant:

void MidiOutAlsa :: sendMessage( const unsigned char *message, size_t size )
{
  long result;
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  unsigned int nBytes = static_cast<unsigned int> (size);
  if ( nBytes > data->bufferSize ) {
    data->bufferSize = nBytes;
    result = snd_midi_event_resize_buffer( data->coder, nBytes );
    if ( result != 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: ALSA error resizing MIDI event buffer.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    free (data->buffer);
    data->buffer = (unsigned char *) malloc( data->bufferSize );
    if ( data->buffer == NULL ) {
      errorString_ = "MidiOutAlsa::initialize: error allocating buffer memory!\n\n";
      error( RtMidiError::MEMORY_ERROR, errorString_ );
      return;
    }
  }

  for ( unsigned int i=0; i<nBytes; ++i ) data->buffer[i] = message[i];

  unsigned int offset = 0;
  while (offset < nBytes) {
    snd_seq_event_t ev;
    snd_seq_ev_clear( &ev );
    snd_seq_ev_set_source( &ev, data->vport );
    snd_seq_ev_set_subs( &ev );
    snd_seq_ev_set_direct( &ev );
    result = snd_midi_event_encode( data->coder, data->buffer + offset,
                                    (long)(nBytes - offset), &ev );
    if ( result < 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: event parsing error!";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }

    if ( ev.type == SND_SEQ_EVENT_NONE ) {
      errorString_ = "MidiOutAlsa::sendMessage: incomplete message!";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }

    offset += result;

    // Send the event.
    result = snd_seq_event_output( data->seq, &ev );
    if ( result < 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: error sending MIDI message to port.";
      error( RtMidiError::WARNING, errorString_ );
      return;
    }
  }
  snd_seq_drain_output( data->seq );
}